

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  bool bVar1;
  ostream *poVar2;
  Value *in_RSI;
  long in_RDI;
  StyledStreamWriter *in_stack_ffffffffffffff80;
  string *psVar3;
  string local_60 [20];
  CommentPlacement in_stack_ffffffffffffffb4;
  Value *in_stack_ffffffffffffffb8;
  string local_30 [32];
  Value *local_10;
  
  local_10 = in_RSI;
  bVar1 = Value::hasComment(in_RSI,commentAfterOnSameLine);
  if (bVar1) {
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x18),' ');
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    std::operator<<(poVar2,local_30);
    std::__cxx11::string::~string(local_30);
  }
  bVar1 = Value::hasComment(local_10,commentAfter);
  if (bVar1) {
    writeIndent(in_stack_ffffffffffffff80);
    poVar2 = *(ostream **)(in_RDI + 0x18);
    psVar3 = local_60;
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    std::operator<<(poVar2,psVar3);
    std::__cxx11::string::~string(local_60);
  }
  *(byte *)(in_RDI + 0x68) = *(byte *)(in_RDI + 0x68) & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}